

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O0

Var Js::JavascriptFunction::ConstructHelper
              (RecyclableObject *function,Var thisArg,Var overridingNewTarget,Var argArray,
              ScriptContext *scriptContext)

{
  ThreadContext *threadContext;
  Var pvVar1;
  undefined1 local_40 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  ScriptContext *scriptContext_local;
  Var argArray_local;
  Var overridingNewTarget_local;
  Var thisArg_local;
  RecyclableObject *function_local;
  
  autoReentrancyHandler._8_8_ = scriptContext;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_40,threadContext);
  pvVar1 = CalloutHelper<true>(function,thisArg,overridingNewTarget,argArray,
                               (ScriptContext *)autoReentrancyHandler._8_8_);
  AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_40);
  return pvVar1;
}

Assistant:

Var JavascriptFunction::ConstructHelper(RecyclableObject* function, Var thisArg, Var overridingNewTarget, Var argArray, ScriptContext* scriptContext)
    {
        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            return CalloutHelper<true>(function, thisArg, overridingNewTarget, argArray, scriptContext);
        }
        END_SAFE_REENTRANT_CALL
    }